

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<unsigned_int,char_const*>
          (NotImplementedException *this,string *msg,uint params,char *params_1)

{
  undefined4 in_register_00000014;
  char *in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,char_const*>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             (uint)params_1,in_R8);
  NotImplementedException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}